

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O0

void libtorrent::aux::
     uninitialized_default_construct<libtorrent::aux::(anonymous_namespace)::busy_block_t*>
               (busy_block_t *first,busy_block_t *last)

{
  busy_block_t *local_20;
  busy_block_t *current;
  busy_block_t *last_local;
  busy_block_t *first_local;
  
  for (local_20 = first; local_20 != last; local_20 = local_20 + 1) {
  }
  return;
}

Assistant:

inline void uninitialized_default_construct(ForwardIt first, ForwardIt last)
{
	using Value = typename std::iterator_traits<ForwardIt>::value_type;
	ForwardIt current = first;
	try {
		for (; current != last; ++current) {
			::new (static_cast<void*>(std::addressof(*current))) Value;
		}
	}  catch (...) {
		for (; first != current; ++first) {
			first->~Value();
		}
		throw;
	}
}